

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

bool __thiscall
vkt::sr::(anonymous_namespace)::TextureGatherInstance::
verify<tcu::TextureCubeView,tcu::Vector<float,3>>
          (TextureGatherInstance *this,ConstPixelBufferAccess *rendered,TextureCubeView *texture,
          Vector<float,_3> (*texCoords) [4],GatherArgs *gatherArgs)

{
  GatherType gatherType;
  OffsetSize offsetSize;
  BVec4 BVar1;
  undefined8 uVar2;
  bool bVar3;
  TestContext *this_00;
  VkPhysicalDeviceProperties *pVVar4;
  PixelOffsets *pPVar5;
  uint local_1cc;
  Vector<unsigned_int,_4> local_1c8;
  undefined1 local_1b8 [8];
  IntLookupPrecision lookupPrec_1;
  int iStack_184;
  undefined1 local_178 [8];
  LookupPrecision lookupPrec;
  int componentNdx;
  undefined1 local_130 [8];
  TexComparePrecision comparePrec;
  Sampler sampler;
  IVec3 uvwBits;
  IVec3 coordBits;
  Vector<int,_4> local_a4;
  Vector<int,_4> local_94;
  undefined1 local_84 [8];
  IVec4 colorBits;
  undefined1 local_68 [8];
  PixelFormat pixelFormat;
  undefined1 local_50 [8];
  MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
  pixelOffsets;
  TestLog *log;
  GatherArgs *gatherArgs_local;
  Vector<float,_3> (*texCoords_local) [4];
  TextureCubeView *texture_local;
  ConstPixelBufferAccess *rendered_local;
  TextureGatherInstance *this_local;
  
  this_00 = Context::getTestContext(*(Context **)(this + 8));
  pixelOffsets.
  super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
  .m_data._8_8_ = tcu::TestContext::getLog(this_00);
  gatherType = *(GatherType *)(this + 0x210);
  offsetSize = *(OffsetSize *)(this + 0x214);
  pVVar4 = Context::getDeviceProperties(*(Context **)(this + 8));
  sr::anon_unknown_0::getOffsetRange
            ((anon_unknown_0 *)&pixelFormat.blueBits,offsetSize,&pVVar4->limits);
  sr::anon_unknown_0::makePixelOffsetsFunctor
            ((MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              *)local_50,gatherType,gatherArgs,(IVec2 *)&pixelFormat.blueBits);
  tcu::PixelFormat::PixelFormat((PixelFormat *)local_68,8,8,8,8);
  sr::anon_unknown_0::TextureTestUtil::getBitsVec
            ((TextureTestUtil *)&local_a4,(PixelFormat *)local_68);
  tcu::operator-((tcu *)&local_94,&local_a4,1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(coordBits.m_data + 1),0);
  tcu::max<int,4>((tcu *)local_84,&local_94,(Vector<int,_4> *)(coordBits.m_data + 1));
  if (*(int *)(this + 0x250) == 0) {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(uvwBits.m_data + 1),0x14,0x14,0);
  }
  else if (*(int *)(this + 0x250) == 2) {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(uvwBits.m_data + 1),10,10,10);
  }
  else if (*(int *)(this + 0x250) == 1) {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(uvwBits.m_data + 1),0x14,0x14,0x14);
  }
  else {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(uvwBits.m_data + 1),-1);
  }
  if (*(int *)(this + 0x250) == 0) {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sampler.seamlessCubeMap,7,7,0);
  }
  else if (*(int *)(this + 0x250) == 2) {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sampler.seamlessCubeMap,6,6,0);
  }
  else if (*(int *)(this + 0x250) == 1) {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sampler.seamlessCubeMap,7,7,7);
  }
  else {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sampler.seamlessCubeMap,-1);
  }
  tcu::Sampler::Sampler((Sampler *)&comparePrec.resultBits);
  comparePrec.resultBits = *(int *)(this + 0x224);
  sampler.lodThreshold = *(float *)(this + 0x220);
  bVar3 = sr::anon_unknown_0::isDepthFormat((TextureFormat *)(this + 0x218));
  if (bVar3) {
    tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_130);
    uVar2 = pixelOffsets.
            super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
            .m_data._8_8_;
    comparePrec.coordBits.m_data[0] = coordBits.m_data[0];
    local_130._0_4_ = uvwBits.m_data[1];
    local_130._4_4_ = uvwBits.m_data[2];
    comparePrec.uvwBits.m_data[0] = uvwBits.m_data[0];
    comparePrec.coordBits.m_data._4_8_ = sampler._52_8_;
    comparePrec.uvwBits.m_data[2] = 0x10;
    comparePrec.pcfBits = local_68._0_4_ + -1;
    sr::anon_unknown_0::PixelCompareRefZDefault::PixelCompareRefZDefault
              ((PixelCompareRefZDefault *)&componentNdx,(IVec2 *)&RENDER_SIZE);
    pPVar5 = de::details::
             UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
             ::operator*((UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                          *)local_50);
    this_local._7_1_ =
         verifyGatherOffsetsCompare<tcu::TextureCubeView,tcu::Vector<float,3>>
                   ((TestLog *)uVar2,rendered,texture,texCoords,(Sampler *)&comparePrec.resultBits,
                    (TexComparePrecision *)local_130,(PixelCompareRefZ *)&componentNdx,pPVar5);
  }
  else {
    lookupPrec.colorMask.m_data = (bool  [4])de::max<int>(0,gatherArgs->componentNdx);
    bVar3 = sr::anon_unknown_0::isUnormFormatType(*(ChannelType *)(this + 0x21c));
    if (bVar3) {
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_178);
      tcu::computeFixedPointThreshold((tcu *)&lookupPrec_1.colorMask,(IVec4 *)local_84);
      lookupPrec.uvwBits.m_data[1]._0_1_ = lookupPrec_1.colorMask.m_data[0];
      lookupPrec.uvwBits.m_data[1]._1_1_ = lookupPrec_1.colorMask.m_data[1];
      lookupPrec.uvwBits.m_data[1]._2_1_ = lookupPrec_1.colorMask.m_data[2];
      lookupPrec.uvwBits.m_data[1]._3_1_ = lookupPrec_1.colorMask.m_data[3];
      lookupPrec.uvwBits.m_data[2] = iStack_184;
      lookupPrec.coordBits.m_data[0] = coordBits.m_data[0];
      local_178._0_4_ = uvwBits.m_data[1];
      local_178._4_4_ = uvwBits.m_data[2];
      lookupPrec.uvwBits.m_data[0] = uvwBits.m_data[0];
      lookupPrec.coordBits.m_data._4_8_ = sampler._52_8_;
      sr::anon_unknown_0::TextureTestUtil::getCompareMask
                ((TextureTestUtil *)(lookupPrec_1.colorThreshold.m_data + 3),(PixelFormat *)local_68
                );
      uVar2 = pixelOffsets.
              super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              .m_data._8_8_;
      BVar1 = lookupPrec.colorMask;
      lookupPrec.colorThreshold.m_data[2] = (float)lookupPrec_1.colorThreshold.m_data[3];
      pPVar5 = de::details::
               UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
               ::operator*((UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                            *)local_50);
      this_local._7_1_ =
           verifyGatherOffsets<float,tcu::LookupPrecision,tcu::TextureCubeView,tcu::Vector<float,3>>
                     ((TestLog *)uVar2,rendered,texture,texCoords,(Sampler *)&comparePrec.resultBits
                      ,(LookupPrecision *)local_178,(int)BVar1.m_data,pPVar5);
    }
    else {
      bVar3 = sr::anon_unknown_0::isUIntFormatType(*(ChannelType *)(this + 0x21c));
      if ((bVar3) ||
         (bVar3 = sr::anon_unknown_0::isSIntFormatType(*(ChannelType *)(this + 0x21c)), bVar3)) {
        tcu::IntLookupPrecision::IntLookupPrecision((IntLookupPrecision *)local_1b8);
        tcu::Vector<unsigned_int,_4>::Vector(&local_1c8,0);
        lookupPrec_1.uvwBits.m_data[1] = local_1c8.m_data[0];
        lookupPrec_1.uvwBits.m_data[2] = local_1c8.m_data[1];
        lookupPrec_1.colorThreshold.m_data[0] = local_1c8.m_data[2];
        lookupPrec_1.colorThreshold.m_data[1] = local_1c8.m_data[3];
        lookupPrec_1.coordBits.m_data[0] = coordBits.m_data[0];
        local_1b8._0_4_ = uvwBits.m_data[1];
        local_1b8._4_4_ = uvwBits.m_data[2];
        lookupPrec_1.uvwBits.m_data[0] = uvwBits.m_data[0];
        lookupPrec_1.coordBits.m_data._4_8_ = sampler._52_8_;
        sr::anon_unknown_0::TextureTestUtil::getCompareMask
                  ((TextureTestUtil *)&local_1cc,(PixelFormat *)local_68);
        lookupPrec_1.colorThreshold.m_data[2] = local_1cc;
        bVar3 = sr::anon_unknown_0::isUIntFormatType(*(ChannelType *)(this + 0x21c));
        uVar2 = pixelOffsets.
                super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                .m_data._8_8_;
        BVar1 = lookupPrec.colorMask;
        if (bVar3) {
          pPVar5 = de::details::
                   UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                   ::operator*((UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                                *)local_50);
          this_local._7_1_ =
               verifyGatherOffsets<unsigned_int,tcu::IntLookupPrecision,tcu::TextureCubeView,tcu::Vector<float,3>>
                         ((TestLog *)uVar2,rendered,texture,texCoords,
                          (Sampler *)&comparePrec.resultBits,(IntLookupPrecision *)local_1b8,
                          (int)BVar1.m_data,pPVar5);
        }
        else {
          bVar3 = sr::anon_unknown_0::isSIntFormatType(*(ChannelType *)(this + 0x21c));
          uVar2 = pixelOffsets.
                  super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                  .m_data._8_8_;
          BVar1 = lookupPrec.colorMask;
          if (bVar3) {
            pPVar5 = de::details::
                     UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                     ::operator*((UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                                  *)local_50);
            this_local._7_1_ =
                 verifyGatherOffsets<int,tcu::IntLookupPrecision,tcu::TextureCubeView,tcu::Vector<float,3>>
                           ((TestLog *)uVar2,rendered,texture,texCoords,
                            (Sampler *)&comparePrec.resultBits,(IntLookupPrecision *)local_1b8,
                            (int)BVar1.m_data,pPVar5);
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  de::details::
  MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
  ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              *)local_50);
  return this_local._7_1_;
}

Assistant:

bool TextureGatherInstance::verify (const ConstPixelBufferAccess&	rendered,
								const TexViewT&					texture,
								const TexCoordT					(&texCoords)[4],
								const GatherArgs&				gatherArgs) const
{
	TestLog& log = m_context.getTestContext().getLog();

	{
		DE_ASSERT(m_colorBufferFormat.order == tcu::TextureFormat::RGBA);
		DE_ASSERT(m_colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8);

		const MovePtr<PixelOffsets>		pixelOffsets	= makePixelOffsetsFunctor(m_baseParams.gatherType, gatherArgs, getOffsetRange(m_baseParams.offsetSize, m_context.getDeviceProperties().limits));
		const tcu::PixelFormat			pixelFormat		= tcu::PixelFormat(8,8,8,8);
		const IVec4						colorBits		= tcu::max(TextureTestUtil::getBitsVec(pixelFormat) - 1, tcu::IVec4(0));
		const IVec3						coordBits		= m_baseParams.textureType == TEXTURETYPE_2D			? IVec3(20,20,0)
														: m_baseParams.textureType == TEXTURETYPE_CUBE			? IVec3(10,10,10)
														: m_baseParams.textureType == TEXTURETYPE_2D_ARRAY		? IVec3(20,20,20)
														: IVec3(-1);
		const IVec3						uvwBits			= m_baseParams.textureType == TEXTURETYPE_2D			? IVec3(7,7,0)
														: m_baseParams.textureType == TEXTURETYPE_CUBE			? IVec3(6,6,0)
														: m_baseParams.textureType == TEXTURETYPE_2D_ARRAY		? IVec3(7,7,7)
														: IVec3(-1);
		tcu::Sampler					sampler;
		sampler.wrapS		= m_baseParams.wrapS;
		sampler.wrapT		= m_baseParams.wrapT;
		sampler.compare		= m_baseParams.shadowCompareMode;

		if (isDepthFormat(m_baseParams.textureFormat))
		{
			tcu::TexComparePrecision comparePrec;
			comparePrec.coordBits		= coordBits;
			comparePrec.uvwBits			= uvwBits;
			comparePrec.referenceBits	= 16;
			comparePrec.resultBits		= pixelFormat.redBits-1;

			return verifyGatherOffsetsCompare(log, rendered, texture, texCoords, sampler, comparePrec, PixelCompareRefZDefault(RENDER_SIZE), *pixelOffsets);
		}
		else
		{
			const int componentNdx = de::max(0, gatherArgs.componentNdx);

			if (isUnormFormatType(m_baseParams.textureFormat.type))
			{
				tcu::LookupPrecision lookupPrec;
				lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(colorBits);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= TextureTestUtil::getCompareMask(pixelFormat);
				return verifyGatherOffsets<float>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
			}
			else if (isUIntFormatType(m_baseParams.textureFormat.type) || isSIntFormatType(m_baseParams.textureFormat.type))
			{
				tcu::IntLookupPrecision		lookupPrec;
				lookupPrec.colorThreshold	= UVec4(0);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= TextureTestUtil::getCompareMask(pixelFormat);

				if (isUIntFormatType(m_baseParams.textureFormat.type))
					return verifyGatherOffsets<deUint32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else if (isSIntFormatType(m_baseParams.textureFormat.type))
					return verifyGatherOffsets<deInt32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else
				{
					DE_ASSERT(false);
					return false;
				}
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}
		}
	}
}